

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O2

void __thiscall
tcu::anon_unknown_4::Test::testRound(Test *this,double arg,double refDown,double refUp)

{
  ostream *poVar1;
  string *psVar2;
  double dVar3;
  Test local_1a8 [2];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,"round(");
  poVar1 = std::ostream::_M_insert<double>(arg);
  std::operator<<(poVar1,", false)");
  std::__cxx11::stringbuf::str();
  psVar2 = (string *)0x0;
  dVar3 = FloatFormat::round((this->m_fmt).
                             super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                             .m_data.ptr,arg);
  check(local_1a8,psVar2,dVar3,refDown);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,"round(");
  poVar1 = std::ostream::_M_insert<double>(arg);
  std::operator<<(poVar1,", true)");
  std::__cxx11::stringbuf::str();
  psVar2 = (string *)0x1;
  dVar3 = FloatFormat::round((this->m_fmt).
                             super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                             .m_data.ptr,arg);
  check(local_1a8,psVar2,dVar3,refUp);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return;
}

Assistant:

void Test::testRound (double arg, double refDown, double refUp) const
{
	{
		ostringstream oss;
		oss << "round(" << arg << ", false)";
		check(oss.str(), m_fmt->round(arg, false), refDown);
	}
	{
		ostringstream oss;
		oss << "round(" << arg << ", true)";
		check(oss.str(), m_fmt->round(arg, true), refUp);
	}
}